

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_confined.cpp
# Opt level: O0

Reals __thiscall
Omega_h::get_edge_pad_dists<3>(Omega_h *this,Mesh *mesh,Read<signed_char> *edges_are_bridges)

{
  LO LVar1;
  void *extraout_RDX;
  Reals RVar2;
  Write<double> local_d8;
  undefined1 local_c8 [8];
  type f;
  string local_80 [32];
  undefined1 local_60 [8];
  Write<double> out;
  undefined1 local_40 [8];
  LOs edges2verts;
  Reals coords;
  Read<signed_char> *edges_are_bridges_local;
  Mesh *mesh_local;
  
  Mesh::coords((Mesh *)&edges2verts.write_.shared_alloc_.direct_ptr);
  Mesh::ask_verts_of((Mesh *)local_40,(Int)mesh);
  LVar1 = Mesh::nedges(mesh);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"",(allocator *)((long)&f.out.shared_alloc_.direct_ptr + 7))
  ;
  Write<double>::Write((Write<double> *)local_60,LVar1,-1.0,(string *)local_80);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)((long)&f.out.shared_alloc_.direct_ptr + 7));
  Read<signed_char>::Read((Read<signed_char> *)local_c8,edges_are_bridges);
  Read<int>::Read((Read<int> *)&f.edges_are_bridges.write_.shared_alloc_.direct_ptr,
                  (Read<int> *)local_40);
  Read<double>::Read((Read<double> *)&f.edges2verts.write_.shared_alloc_.direct_ptr,
                     (Read<double> *)&edges2verts.write_.shared_alloc_.direct_ptr);
  Write<double>::Write
            ((Write<double> *)&f.coords.write_.shared_alloc_.direct_ptr,(Write<double> *)local_60);
  LVar1 = Mesh::nedges(mesh);
  parallel_for<Omega_h::get_edge_pad_dists<3>(Omega_h::Mesh*,Omega_h::Read<signed_char>)::_lambda(int)_1_&>
            (LVar1,(type *)local_c8);
  Write<double>::Write(&local_d8,(Write<signed_char> *)local_60);
  Read<double>::Read((Read<double> *)this,&local_d8);
  Write<double>::~Write(&local_d8);
  get_edge_pad_dists<3>(Omega_h::Mesh*,Omega_h::Read<signed_char>)::{lambda(int)#1}::~Mesh
            ((_lambda_int__1_ *)local_c8);
  Write<double>::~Write((Write<double> *)local_60);
  Read<int>::~Read((Read<int> *)local_40);
  Read<double>::~Read((Read<double> *)&edges2verts.write_.shared_alloc_.direct_ptr);
  RVar2.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar2.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar2.write_.shared_alloc_;
}

Assistant:

Reals get_edge_pad_dists(Mesh* mesh, Read<I8> edges_are_bridges) {
  auto coords = mesh->coords();
  auto edges2verts = mesh->ask_verts_of(EDGE);
  auto out = Write<Real>(mesh->nedges(), -1.0);
  auto f = OMEGA_H_LAMBDA(LO edge) {
    if (!edges_are_bridges[edge]) return;
    auto eev2v = gather_verts<2>(edges2verts, edge);
    auto eev2x = gather_vectors<2, dim>(coords, eev2v);
    auto h = norm(eev2x[1] - eev2x[0]);
    out[edge] = h;
  };
  parallel_for(mesh->nedges(), f);
  return out;
}